

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O0

string * ApprovalFileLog::getLogFilePath_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *rootDirectory;
  string *filePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  char *local_10;
  
  local_10 = "";
  local_11 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"./.approval_tests_temp",&local_59);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"./.approval_tests_temp",&local_91);
  ApprovalTests::SystemUtils::ensureDirectoryExists((string *)0x201890);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return __lhs;
}

Assistant:

std::string ApprovalFileLog::getLogFilePath()
{
    //auto const rootDirectory = ApprovalTests::TestName::getRootDirectory();
    auto const rootDirectory = "";
    // Note: Need to figure out where the actual root directory is.
    std::string const filePath =
        rootDirectory + std::string(APPROVAL_TEMP_DIRECTORY) + "/.approved_files.log";
    ApprovalTests::SystemUtils::ensureDirectoryExists(APPROVAL_TEMP_DIRECTORY);
    return filePath;
}